

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O2

void __thiscall cppnet::Dispatcher::Connect(Dispatcher *this,string *ip,uint16_t port)

{
  pthread_t pVar1;
  __0 *this_00;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  anon_class_48_3_02cd77fa task;
  
  std::__cxx11::string::string((string *)&task,(string *)ip);
  task.port = port;
  task.this = this;
  pVar1 = pthread_self();
  if (pVar1 == (this->_local_thread_id)._M_thread) {
    Connect::anon_class_48_3_02cd77fa::operator()(&task);
  }
  else {
    local_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    this_00 = (__0 *)operator_new(0x30);
    Connect(std::__cxx11::string_const&,unsigned_short)::$_0::__0(this_00,&task);
    pcStack_50 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:107:17)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:107:17)>
               ::_M_manager;
    local_68._M_unused._0_8_ = (undefined8)this_00;
    PostTask(this,(Task *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
  }
  std::__cxx11::string::~string((string *)&task);
  return;
}

Assistant:

void Dispatcher::Connect(const std::string& ip, uint16_t port) {
    auto task = [ip, port, this]() {
        auto sock = MakeRWSocket();
        sock->SetDispatcher(shared_from_this());
        sock->SetEventActions(_event_actions);
        sock->SetCppNetBase(_cppnet_base.lock());
        sock->Connect(ip, port);
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}